

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retrieval.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pbVar9;
  int32_t iVar10;
  bool bVar11;
  char cVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  common_log *pcVar17;
  long *plVar18;
  long lVar19;
  undefined8 uVar20;
  ulong uVar21;
  pointer pcVar22;
  pointer pcVar23;
  char *fmt;
  pointer pbVar24;
  int iVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *context_file;
  pointer pbVar26;
  ulong uVar27;
  pointer pbVar28;
  llama_context *plVar29;
  float *__first;
  float fVar30;
  vector<chunk,_std::allocator<chunk>_> chunks;
  vector<chunk,_std::allocator<chunk>_> file_chunk;
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> similarities;
  vector<float,_std::allocator<float>_> embeddings;
  common_init_result llama_init;
  string query;
  vector<float,_std::allocator<float>_> query_emb;
  llama_batch batch;
  llama_batch query_batch;
  common_params params;
  vector<chunk,_std::allocator<chunk>_> local_1b28;
  llama_context *local_1b08;
  pointer local_1b00;
  undefined1 local_1af8 [16];
  pointer local_1ae8;
  undefined1 local_1ad8 [16];
  long local_1ac8;
  undefined1 local_1ab8 [17];
  undefined7 uStack_1aa7;
  undefined1 local_1a98 [16];
  undefined1 local_1a88 [24];
  _Alloc_hider local_1a70;
  size_type local_1a68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a60;
  undefined1 local_1a50 [16];
  undefined1 local_1a40 [16];
  undefined1 local_1a30 [16];
  string local_1a20;
  undefined1 local_1a00 [16];
  undefined1 local_19f0 [16];
  undefined8 local_19e0;
  undefined1 local_19d8 [16];
  pointer local_19c8;
  void *pvStack_19c0;
  undefined8 local_19b8;
  long lStack_19b0;
  vector<float,_std::allocator<float>_> local_19a8;
  pair<int,_float> local_1990;
  undefined1 local_1988 [1032];
  llama_batch local_1580 [9];
  common_params local_1378;
  
  common_params::common_params(&local_1378);
  bVar11 = common_params_parse(argc,argv,&local_1378,LLAMA_EXAMPLE_RETRIEVAL,print_usage);
  iVar15 = 1;
  if (!bVar11) goto LAB_00126295;
  common_init();
  local_1378.n_ubatch = local_1378.n_batch;
  local_1378.embedding = true;
  if (local_1378.chunk_size < 1) {
    if (common_log_verbosity_thold < 0) goto LAB_00126295;
    pcVar17 = common_log_main();
    fmt = "chunk_size must be positive\n";
  }
  else {
    if (local_1378.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1378.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar28 = local_1378.context_files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar26 = local_1378.context_files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar24 = local_1378.context_files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (-1 < common_log_verbosity_thold) {
        pcVar17 = common_log_main();
        common_log_add(pcVar17,GGML_LOG_LEVEL_INFO,"processing files:\n");
        pbVar28 = local_1378.context_files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar26 = local_1378.context_files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar24 = local_1378.context_files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pbVar9 = local_1378.context_files.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
          pbVar28 !=
          local_1378.context_files.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar28 = pbVar28 + 1) {
        local_1378.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar26;
        local_1378.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar24;
        if (-1 < common_log_verbosity_thold) {
          pcVar17 = common_log_main();
          common_log_add(pcVar17,GGML_LOG_LEVEL_INFO,"%s\n",(pbVar28->_M_dataplus)._M_p);
        }
        pbVar26 = local_1378.context_files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar24 = local_1378.context_files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_1378.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
      }
      local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pbVar26 != pbVar24) {
        paVar1 = &local_1a20.field_2;
        local_1b00 = pbVar24;
        do {
          iVar10 = local_1378.chunk_size;
          local_1af8 = (undefined1  [16])0x0;
          local_1ae8 = (pointer)0x0;
          std::ifstream::ifstream(local_1580,(pbVar26->_M_dataplus)._M_p,_S_in);
          cVar12 = std::__basic_file<char>::is_open();
          if (cVar12 == '\0') {
            if (-1 < common_log_verbosity_thold) {
              pcVar17 = common_log_main();
              common_log_add(pcVar17,GGML_LOG_LEVEL_ERROR,"could not open file %s\n",
                             (pbVar26->_M_dataplus)._M_p);
            }
          }
          else {
            local_1a98._0_8_ = local_1a98 + 0x10;
            local_1a98._8_8_ = (__uniq_ptr_impl<llama_context,_llama_context_deleter>)0x0;
            local_1a88[0] = '\0';
            local_1a70._M_p = (pointer)&local_1a60;
            local_1a68 = 0;
            local_1a60._M_local_buf[0] = '\0';
            local_1a30 = (undefined1  [16])0x0;
            local_1a40 = (undefined1  [16])0x0;
            local_1a50 = (undefined1  [16])0x0;
            local_1ab8._0_8_ = local_1ab8 + 0x10;
            local_1ab8._8_8_ = (pointer)0x0;
            local_1ab8[0x10] = 0;
            plVar29 = (llama_context *)0x0;
            while( true ) {
              plVar18 = (long *)std::istream::read((char *)local_1580,(long)local_1988);
              if ((*(byte *)((long)plVar18 + *(long *)(*plVar18 + -0x18) + 0x20) & 5) != 0) break;
              local_1a20._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a20,local_1988,
                         (undefined1 *)((long)local_1580[0].token + (long)local_1988));
              std::__cxx11::string::_M_append((char *)local_1ab8,(ulong)local_1a20._M_dataplus._M_p)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a20._M_dataplus._M_p != paVar1) {
                operator_delete(local_1a20._M_dataplus._M_p,
                                local_1a20.field_2._M_allocated_capacity + 1);
              }
              lVar19 = std::__cxx11::string::find
                                 ((char *)local_1ab8,
                                  (ulong)local_1378.chunk_separator._M_dataplus._M_p,0);
              while (lVar19 != -1) {
                std::__cxx11::string::substr((ulong)&local_1a20,(ulong)local_1ab8);
                std::__cxx11::string::_M_append
                          ((char *)&local_1a70,(ulong)local_1a20._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a20._M_dataplus._M_p != paVar1) {
                  operator_delete(local_1a20._M_dataplus._M_p,
                                  local_1a20.field_2._M_allocated_capacity + 1);
                }
                if (iVar10 < (int)local_1a68) {
                  local_1a88._16_8_ = plVar29;
                  std::__cxx11::string::_M_assign((string *)local_1a98);
                  std::vector<chunk,_std::allocator<chunk>_>::push_back
                            ((vector<chunk,_std::allocator<chunk>_> *)local_1af8,
                             (value_type *)local_1a98);
                  local_1b08 = (llama_context *)(long)(int)local_1a68;
                  local_19e0 = 0;
                  local_19f0 = (undefined1  [16])0x0;
                  local_1a20.field_2 =
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        )0x0;
                  local_1a20._M_string_length = 0;
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = local_19f0 + 8;
                  local_1a00 = auVar6 << 0x40;
                  local_19b8 = 0;
                  lStack_19b0 = 0;
                  local_19c8 = (pointer)0x0;
                  pvStack_19c0 = (void *)0x0;
                  local_19d8 = (undefined1  [16])0x0;
                  local_1a20._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::operator=((string *)local_1a98,(string *)&local_1a20);
                  local_1a88._16_8_ = local_1a00._0_8_;
                  std::__cxx11::string::operator=((string *)&local_1a70,(string *)(local_1a00 + 8));
                  uVar7 = local_1a50._0_8_;
                  uVar8 = local_1a40._0_8_;
                  local_1a50 = local_19d8;
                  local_1a40._0_8_ = local_19c8;
                  local_19c8 = (pointer)0x0;
                  local_19d8 = ZEXT816(0);
                  if ((pointer)uVar7 != (pointer)0x0) {
                    operator_delete((void *)uVar7,uVar8 - uVar7);
                  }
                  uVar8 = local_1a30._8_8_;
                  uVar7 = local_1a40._8_8_;
                  local_1a40._8_8_ = pvStack_19c0;
                  local_1a30._8_8_ = lStack_19b0;
                  local_1a30._0_8_ = local_19b8;
                  pvStack_19c0 = (void *)0x0;
                  local_19b8 = 0;
                  lStack_19b0 = 0;
                  if (((pointer)uVar7 != (pointer)0x0) &&
                     (operator_delete((void *)uVar7,uVar8 - uVar7), pvStack_19c0 != (void *)0x0)) {
                    operator_delete(pvStack_19c0,lStack_19b0 - (long)pvStack_19c0);
                  }
                  if ((void *)local_19d8._0_8_ != (void *)0x0) {
                    operator_delete((void *)local_19d8._0_8_,(long)local_19c8 - local_19d8._0_8_);
                  }
                  if ((undefined1 *)local_1a00._8_8_ != local_19f0 + 8) {
                    operator_delete((void *)local_1a00._8_8_,local_19f0._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1a20._M_dataplus._M_p != paVar1) {
                    operator_delete(local_1a20._M_dataplus._M_p,
                                    local_1a20.field_2._M_allocated_capacity + 1);
                  }
                  plVar29 = local_1b08 + (long)&plVar29->field_0x0;
                }
                std::__cxx11::string::substr((ulong)&local_1a20,(ulong)local_1ab8);
                std::__cxx11::string::operator=((string *)local_1ab8,(string *)&local_1a20);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1a20._M_dataplus._M_p != paVar1) {
                  operator_delete(local_1a20._M_dataplus._M_p,
                                  local_1a20.field_2._M_allocated_capacity + 1);
                }
                lVar19 = std::__cxx11::string::find
                                   ((char *)local_1ab8,
                                    (ulong)local_1378.chunk_separator._M_dataplus._M_p,0);
              }
            }
            if (local_1a68 != 0) {
              if (local_1af8._0_8_ == local_1af8._8_8_) {
                local_1a88._16_8_ = plVar29;
                std::__cxx11::string::_M_assign((string *)local_1a98);
                std::vector<chunk,_std::allocator<chunk>_>::push_back
                          ((vector<chunk,_std::allocator<chunk>_> *)local_1af8,
                           (value_type *)local_1a98);
              }
              else {
                std::__cxx11::string::_M_append
                          ((char *)&((pointer)(local_1af8._8_8_ + -0x78))->textdata,
                           (ulong)local_1a70._M_p);
              }
            }
            std::ifstream::close();
            if ((undefined1 *)local_1ab8._0_8_ != local_1ab8 + 0x10) {
              operator_delete((void *)local_1ab8._0_8_,CONCAT71(uStack_1aa7,local_1ab8[0x10]) + 1);
            }
            pbVar24 = local_1b00;
            if ((pointer)local_1a40._8_8_ != (pointer)0x0) {
              operator_delete((void *)local_1a40._8_8_,local_1a30._8_8_ - local_1a40._8_8_);
            }
            if ((pointer)local_1a50._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_1a50._0_8_,local_1a40._0_8_ - local_1a50._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a70._M_p != &local_1a60) {
              operator_delete(local_1a70._M_p,
                              CONCAT71(local_1a60._M_allocated_capacity._1_7_,
                                       local_1a60._M_local_buf[0]) + 1);
            }
            if ((pointer)local_1a98._0_8_ != (pointer)(local_1a98 + 0x10)) {
              operator_delete((void *)local_1a98._0_8_,CONCAT71(local_1a88._1_7_,local_1a88[0]) + 1)
              ;
            }
          }
          std::ifstream::~ifstream(local_1580);
          std::vector<chunk,std::allocator<chunk>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<chunk*,std::vector<chunk,std::allocator<chunk>>>>
                    ((vector<chunk,std::allocator<chunk>> *)&local_1b28,
                     local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_1af8._0_8_,local_1af8._8_8_);
          std::vector<chunk,_std::allocator<chunk>_>::~vector
                    ((vector<chunk,_std::allocator<chunk>_> *)local_1af8);
          pbVar26 = pbVar26 + 1;
        } while (pbVar26 != pbVar24);
      }
      if (-1 < common_log_verbosity_thold) {
        pcVar17 = common_log_main();
        common_log_add(pcVar17,GGML_LOG_LEVEL_INFO,"Number of chunks: %zu\n",
                       ((long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) * -0x1111111111111111);
      }
      llama_backend_init();
      llama_numa_init(local_1378.numa);
      common_init_from_params((common_init_result *)local_1a98,&local_1378);
      uVar8 = local_1a98._8_8_;
      uVar7 = local_1a98._0_8_;
      if ((pointer)local_1a98._0_8_ == (pointer)0x0) {
        iVar15 = 1;
        if (-1 < common_log_verbosity_thold) {
          pcVar17 = common_log_main();
          common_log_add(pcVar17,GGML_LOG_LEVEL_ERROR,"%s: unable to load model\n","main");
        }
      }
      else {
        uVar20 = llama_model_get_vocab(local_1a98._0_8_);
        uVar13 = llama_model_n_ctx_train(uVar7);
        uVar14 = llama_n_ctx(uVar8);
        iVar15 = llama_pooling_type(uVar8);
        if (iVar15 != 0) {
          if (-1 < common_log_verbosity_thold && (int)uVar13 < (int)uVar14) {
            pcVar17 = common_log_main();
            common_log_add(pcVar17,GGML_LOG_LEVEL_WARN,
                           "%s: warning: model was trained on only %d context tokens (%d specified)\n"
                           ,"main",(ulong)uVar13,(ulong)uVar14);
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar17 = common_log_main();
            common_log_add(pcVar17,GGML_LOG_LEVEL_INFO,"\n");
            if (-1 < common_log_verbosity_thold) {
              pcVar17 = common_log_main();
              common_params_get_system_info_abi_cxx11_((string *)local_1988,&local_1378);
              common_log_add(pcVar17,GGML_LOG_LEVEL_INFO,"%s\n",
                             CONCAT44(local_1988._4_4_,local_1988._0_4_));
              if ((undefined1 *)CONCAT44(local_1988._4_4_,local_1988._0_4_) != local_1988 + 0x10) {
                operator_delete((undefined1 *)CONCAT44(local_1988._4_4_,local_1988._0_4_),
                                local_1988._16_8_ + 1);
              }
            }
          }
          uVar21 = (ulong)local_1378.n_batch;
          if (local_1378.n_batch < local_1378.n_ctx) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/retrieval/retrieval.cpp"
                       ,0xba,"GGML_ASSERT(%s) failed","params.n_batch >= params.n_ctx");
          }
          local_1b00 = (pointer)uVar7;
          pcVar23 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                    super__Vector_impl_data._M_finish;
          local_1b08 = (llama_context *)uVar8;
          pcVar22 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
              super__Vector_impl_data._M_start !=
              local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            iVar15 = 0;
            do {
              common_tokenize((vector<int,_std::allocator<int>_> *)local_1988,local_1b08,
                              &pcVar22->textdata,true,false);
              uVar27 = local_1988._8_8_ - CONCAT44(local_1988._4_4_,local_1988._0_4_) >> 2;
              if (uVar21 < uVar27) {
                iVar15 = 1;
                if (-1 < common_log_verbosity_thold) {
                  pcVar17 = common_log_main();
                  common_log_add(pcVar17,GGML_LOG_LEVEL_ERROR,
                                 "%s: chunk size (%lld) exceeds batch size (%lld), increase batch size and re-run\n"
                                 ,"main",local_1988._8_8_ -
                                         CONCAT44(local_1988._4_4_,local_1988._0_4_) >> 2,uVar21);
                }
              }
              else {
                iVar16 = llama_vocab_eos(uVar20);
                if ((-1 < iVar16) &&
                   (((int *)CONCAT44(local_1988._4_4_,local_1988._0_4_) == (int *)local_1988._8_8_
                    || (iVar16 = *(int *)(local_1988._8_8_ + -4), iVar25 = llama_vocab_eos(uVar20),
                       iVar16 != iVar25)))) {
                  local_1580[0].n_tokens = llama_vocab_eos(uVar20);
                  if (local_1988._8_8_ == local_1988._16_8_) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              ((vector<int,_std::allocator<int>_> *)local_1988,
                               (iterator)local_1988._8_8_,&local_1580[0].n_tokens);
                  }
                  else {
                    *(int32_t *)local_1988._8_8_ = local_1580[0].n_tokens;
                    local_1988._8_8_ = local_1988._8_8_ + 4;
                  }
                }
                std::vector<int,_std::allocator<int>_>::operator=
                          (&pcVar22->tokens,(vector<int,_std::allocator<int>_> *)local_1988);
              }
              pvVar3 = (void *)CONCAT44(local_1988._4_4_,local_1988._0_4_);
              if (pvVar3 != (void *)0x0) {
                operator_delete(pvVar3,local_1988._16_8_ - (long)pvVar3);
              }
              if (uVar21 < uVar27) goto LAB_00126261;
              pcVar22 = pcVar22 + 1;
            } while (pcVar22 != pcVar23);
            pcVar22 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar13 = (int)((ulong)((long)pcVar22 -
                                (long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
          if ((local_1378.verbose_prompt == true) && (0 < (int)uVar13)) {
            uVar27 = 0;
            do {
              if (-1 < common_log_verbosity_thold) {
                pcVar17 = common_log_main();
                common_log_add(pcVar17,GGML_LOG_LEVEL_INFO,"%s: prompt %d: \'%s\'\n","main",
                               uVar27 & 0xffffffff,
                               local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar27].textdata._M_dataplus._M_p);
                if (-1 < common_log_verbosity_thold) {
                  pcVar17 = common_log_main();
                  common_log_add(pcVar17,GGML_LOG_LEVEL_INFO,
                                 "%s: number of tokens in prompt = %zu\n","main",
                                 (long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar27].tokens.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                       _M_impl.super__Vector_impl_data._M_start[uVar27].tokens.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 2);
                }
              }
              pcVar23 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (0 < (int)((ulong)((long)local_1b28.
                                          super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                                          super__Vector_impl_data._M_start[uVar27].tokens.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                   (long)local_1b28.
                                         super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                                         super__Vector_impl_data._M_start[uVar27].tokens.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start) >> 2)) {
                lVar19 = 0;
                do {
                  if (-1 < common_log_verbosity_thold) {
                    pcVar17 = common_log_main();
                    uVar13 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar27].tokens.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar19];
                    common_token_to_piece_abi_cxx11_((string *)local_1988,local_1b08,uVar13,true);
                    common_log_add(pcVar17,GGML_LOG_LEVEL_INFO,"%6d -> \'%s\'\n",(ulong)uVar13,
                                   CONCAT44(local_1988._4_4_,local_1988._0_4_));
                    if ((undefined1 *)CONCAT44(local_1988._4_4_,local_1988._0_4_) !=
                        local_1988 + 0x10) {
                      operator_delete((undefined1 *)CONCAT44(local_1988._4_4_,local_1988._0_4_),
                                      local_1988._16_8_ + 1);
                    }
                    pcVar23 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                              super__Vector_impl_data._M_start;
                  }
                  lVar19 = lVar19 + 1;
                } while (lVar19 < (int)((ulong)((long)pcVar23[uVar27].tokens.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_finish -
                                               (long)pcVar23[uVar27].tokens.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start) >> 2)
                        );
              }
              if (-1 < common_log_verbosity_thold) {
                pcVar17 = common_log_main();
                common_log_add(pcVar17,GGML_LOG_LEVEL_INFO,"\n\n");
                pcVar23 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                          super__Vector_impl_data._M_start;
              }
              uVar27 = uVar27 + 1;
              uVar13 = (int)((long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pcVar23 >> 3) *
                       -0x11111111;
            } while ((long)uVar27 < (long)(int)uVar13);
          }
          llama_batch_init(local_1988,uVar21,0,1);
          iVar16 = llama_model_n_embd(local_1b00);
          local_1580[0].n_tokens = 0;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)local_1ab8,
                     (long)(int)(iVar16 * uVar13),(value_type_conflict2 *)local_1580,
                     (allocator_type *)&local_1a20);
          __first = (float *)local_1ab8._0_8_;
          iVar15 = 0;
          iVar25 = 0;
          if (0 < (int)uVar13) {
            local_1b00 = (pointer)((ulong)uVar13 * 0x78);
            pbVar28 = (pointer)0x0;
            iVar25 = 0;
            iVar15 = 0;
            do {
              pcVar23 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                        super__Vector_impl_data._M_start;
              if (uVar21 < (ulong)((long)(int)local_1988._0_4_ +
                                  (*(long *)((long)&((local_1b28.
                                                                                                            
                                                  super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->tokens)
                                                  .super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                            (long)pbVar28) -
                                   *(long *)((long)&((local_1b28.
                                                                                                            
                                                  super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->tokens)
                                                  .super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                            (long)&(pbVar28->_M_dataplus)._M_p) >> 2))) {
                batch_decode(local_1b08,(llama_batch *)local_1988,__first + iVar15 * iVar16,iVar25,
                             iVar16);
                common_batch_clear((llama_batch *)local_1988);
                iVar15 = iVar15 + iVar25;
                iVar25 = 0;
              }
              batch_add_seq((llama_batch *)local_1988,
                            (vector<int,_std::allocator<int>_> *)
                            ((long)&pbVar28[2]._M_string_length + (long)&pcVar23->filename),iVar25);
              iVar25 = iVar25 + 1;
              pbVar28 = (pointer)((long)&pbVar28[3].field_2 + 8);
            } while (local_1b00 != pbVar28);
          }
          batch_decode(local_1b08,(llama_batch *)local_1988,__first + iVar15 * iVar16,iVar25,iVar16)
          ;
          if (0 < (int)uVar13) {
            lVar19 = 0;
            do {
              std::vector<float,std::allocator<float>>::vector<float*,void>
                        ((vector<float,std::allocator<float>> *)local_1580,__first,__first + iVar16,
                         (allocator_type *)&local_1a20);
              std::vector<float,_std::allocator<float>_>::_M_move_assign
                        ((vector<float,_std::allocator<float>_> *)
                         ((long)&((local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->embedding).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar19),local_1580);
              pvVar3 = (void *)CONCAT44(local_1580[0]._4_4_,local_1580[0].n_tokens);
              if (pvVar3 != (void *)0x0) {
                operator_delete(pvVar3,(long)local_1580[0].embd - (long)pvVar3);
              }
              lVar2 = *(long *)((long)&((local_1b28.
                                         super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                                         super__Vector_impl_data._M_start)->tokens).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar19);
              if (*(long *)((long)&((local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->tokens).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish + lVar19) != lVar2) {
                *(long *)((long)&((local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->tokens).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish + lVar19) = lVar2;
              }
              lVar19 = lVar19 + 0x78;
              __first = __first + iVar16;
            } while ((ulong)uVar13 * 0x78 - lVar19 != 0);
          }
          llama_batch_init(local_1580,uVar21,0,1);
          local_1a20._M_dataplus._M_p = (pointer)&local_1a20.field_2;
          local_1a20._M_string_length = 0;
          auVar4[0xf] = 0;
          auVar4._0_15_ = local_1a20.field_2._1_15_;
          local_1a20.field_2 =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                )(auVar4 << 8);
          do {
            if (-1 < common_log_verbosity_thold) {
              pcVar17 = common_log_main();
              common_log_add(pcVar17,GGML_LOG_LEVEL_NONE,"Enter query: ");
            }
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&std::cin,(string *)&local_1a20);
            common_tokenize((vector<int,_std::allocator<int>_> *)local_1af8,local_1b08,&local_1a20,
                            true,false);
            batch_add_seq(local_1580,(vector<int,_std::allocator<int>_> *)local_1af8,0);
            auVar5._12_4_ = 0;
            auVar5._0_12_ = local_1ad8._4_12_;
            local_1ad8 = auVar5 << 0x20;
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_19a8,(long)iVar16,(value_type_conflict2 *)local_1ad8,
                       (allocator_type *)&local_1990);
            batch_decode(local_1b08,local_1580,
                         local_19a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,1,iVar16);
            common_batch_clear(local_1580);
            local_1ad8 = (undefined1  [16])0x0;
            local_1ac8 = 0;
            if ((int)uVar13 < 1) {
              local_1ad8._0_8_ = 0;
            }
            else {
              lVar19 = 0x60;
              uVar21 = 0;
              do {
                fVar30 = common_embd_similarity_cos
                                   (*(float **)
                                     ((long)&((local_1b28.
                                               super__Vector_base<chunk,_std::allocator<chunk>_>.
                                               _M_impl.super__Vector_impl_data._M_start)->filename).
                                             _M_dataplus._M_p + lVar19),
                                    local_19a8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start,iVar16);
                local_1990 = (pair<int,_float>)(((ulong)(uint)fVar30 << 0x20) + uVar21);
                std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
                emplace_back<std::pair<int,float>>
                          ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)
                           local_1ad8,&local_1990);
                uVar21 = uVar21 + 1;
                lVar19 = lVar19 + 0x78;
              } while (uVar13 != uVar21);
            }
            std::
            sort<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,main::__0>
                      (local_1ad8._0_8_);
            if (-1 < common_log_verbosity_thold) {
              pcVar17 = common_log_main();
              common_log_add(pcVar17,GGML_LOG_LEVEL_NONE,"Top %d similar chunks:\n",
                             (ulong)(uint)local_1378.sampling.top_k);
            }
            iVar15 = (int)((ulong)((long)local_1b28.
                                         super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                  (long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3);
            uVar14 = iVar15 * -0x11111111;
            if (SBORROW4(local_1378.sampling.top_k,uVar14) !=
                local_1378.sampling.top_k + iVar15 * 0x11111111 < 0) {
              uVar14 = local_1378.sampling.top_k;
            }
            if (0 < (int)uVar14) {
              lVar19 = 0;
              do {
                if (-1 < common_log_verbosity_thold) {
                  pcVar17 = common_log_main();
                  common_log_add(pcVar17,GGML_LOG_LEVEL_NONE,"filename: %s\n",
                                 local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [*(int *)(local_1ad8._0_8_ + lVar19 * 8)].filename._M_dataplus._M_p
                                );
                  if (-1 < common_log_verbosity_thold) {
                    pcVar17 = common_log_main();
                    common_log_add(pcVar17,GGML_LOG_LEVEL_NONE,"filepos: %lld\n",
                                   local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [*(int *)(local_1ad8._0_8_ + lVar19 * 8)].filepos);
                    if (-1 < common_log_verbosity_thold) {
                      pcVar17 = common_log_main();
                      common_log_add(pcVar17,GGML_LOG_LEVEL_NONE,"similarity: %f\n",
                                     (double)*(float *)(local_1ad8._0_8_ + 4 + lVar19 * 8));
                      if (-1 < common_log_verbosity_thold) {
                        pcVar17 = common_log_main();
                        common_log_add(pcVar17,GGML_LOG_LEVEL_NONE,"textdata:\n%s\n",
                                       local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                       _M_impl.super__Vector_impl_data._M_start
                                       [*(int *)(local_1ad8._0_8_ + lVar19 * 8)].textdata.
                                       _M_dataplus._M_p);
                        if (-1 < common_log_verbosity_thold) {
                          pcVar17 = common_log_main();
                          common_log_add(pcVar17,GGML_LOG_LEVEL_NONE,"--------------------\n");
                        }
                      }
                    }
                  }
                }
                lVar19 = lVar19 + 1;
                iVar15 = (int)((ulong)((long)local_1b28.
                                             super__Vector_base<chunk,_std::allocator<chunk>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_1b28.
                                            super__Vector_base<chunk,_std::allocator<chunk>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3);
                uVar14 = iVar15 * -0x11111111;
                if (SBORROW4(local_1378.sampling.top_k,uVar14) !=
                    local_1378.sampling.top_k + iVar15 * 0x11111111 < 0) {
                  uVar14 = local_1378.sampling.top_k;
                }
              } while (lVar19 < (int)uVar14);
            }
            if ((void *)local_1ad8._0_8_ != (void *)0x0) {
              operator_delete((void *)local_1ad8._0_8_,local_1ac8 - local_1ad8._0_8_);
            }
            if (local_19a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (float *)0x0) {
              operator_delete(local_19a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_19a8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_19a8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if ((pointer)local_1af8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_1af8._0_8_,(long)local_1ae8 - local_1af8._0_8_);
            }
          } while( true );
        }
        iVar15 = 1;
        if (-1 < common_log_verbosity_thold) {
          pcVar17 = common_log_main();
          common_log_add(pcVar17,GGML_LOG_LEVEL_ERROR,"%s: pooling type NONE not supported\n","main"
                        );
        }
      }
LAB_00126261:
      std::
      vector<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
      ::~vector((vector<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
                 *)(local_1a98 + 0x10));
      std::unique_ptr<llama_context,_llama_context_deleter>::~unique_ptr
                ((unique_ptr<llama_context,_llama_context_deleter> *)(local_1a98 + 8));
      std::unique_ptr<llama_model,_llama_model_deleter>::~unique_ptr
                ((unique_ptr<llama_model,_llama_model_deleter> *)local_1a98);
      std::vector<chunk,_std::allocator<chunk>_>::~vector(&local_1b28);
      goto LAB_00126295;
    }
    if (common_log_verbosity_thold < 0) goto LAB_00126295;
    pcVar17 = common_log_main();
    fmt = "context_files must be specified\n";
  }
  common_log_add(pcVar17,GGML_LOG_LEVEL_ERROR,fmt);
LAB_00126295:
  common_params::~common_params(&local_1378);
  return iVar15;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_RETRIEVAL, print_usage)) {
        return 1;
    }

    common_init();

    // For BERT models, batch size must be equal to ubatch size
    params.n_ubatch = params.n_batch;
    params.embedding = true;

    if (params.chunk_size <= 0) {
        LOG_ERR("chunk_size must be positive\n");
        return 1;
    }
    if (params.context_files.empty()) {
        LOG_ERR("context_files must be specified\n");
        return 1;
    }

    LOG_INF("processing files:\n");
    for (auto & context_file : params.context_files) {
        LOG_INF("%s\n", context_file.c_str());
    }

    std::vector<chunk> chunks;
    for (auto & context_file : params.context_files) {
        std::vector<chunk> file_chunk = chunk_file(context_file, params.chunk_size, params.chunk_separator);
        chunks.insert(chunks.end(), file_chunk.begin(), file_chunk.end());
    }
    LOG_INF("Number of chunks: %zu\n", chunks.size());

    llama_backend_init();
    llama_numa_init(params.numa);

    // load the model
    common_init_result llama_init = common_init_from_params(params);

    llama_model * model = llama_init.model.get();
    llama_context * ctx = llama_init.context.get();

    if (model == NULL) {
        LOG_ERR("%s: unable to load model\n", __func__);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    const int n_ctx_train = llama_model_n_ctx_train(model);
    const int n_ctx = llama_n_ctx(ctx);

    const enum llama_pooling_type pooling_type = llama_pooling_type(ctx);
    if (pooling_type == LLAMA_POOLING_TYPE_NONE) {
        LOG_ERR("%s: pooling type NONE not supported\n", __func__);
        return 1;
    }

    if (n_ctx > n_ctx_train) {
        LOG_WRN("%s: warning: model was trained on only %d context tokens (%d specified)\n",
                __func__, n_ctx_train, n_ctx);
    }

    // print system information
    {
        LOG_INF("\n");
        LOG_INF("%s\n", common_params_get_system_info(params).c_str());
    }

    // max batch size
    const uint64_t n_batch = params.n_batch;
    GGML_ASSERT(params.n_batch >= params.n_ctx);

    // tokenize the prompts and trim
    for (auto & chunk : chunks) {
        auto inp = common_tokenize(ctx, chunk.textdata, true, false);
        if (inp.size() > n_batch) {
            LOG_ERR("%s: chunk size (%lld) exceeds batch size (%lld), increase batch size and re-run\n",
                    __func__, (long long int) inp.size(), (long long int) n_batch);
            return 1;
        }
        // add eos if not present
        if (llama_vocab_eos(vocab) >= 0 && (inp.empty() || inp.back() != llama_vocab_eos(vocab))) {
            inp.push_back(llama_vocab_eos(vocab));
        }
        chunk.tokens = inp;
    }

    // tokenization stats
    if (params.verbose_prompt) {
        for (int i = 0; i < (int) chunks.size(); i++) {
            LOG_INF("%s: prompt %d: '%s'\n", __func__, i, chunks[i].textdata.c_str());
            LOG_INF("%s: number of tokens in prompt = %zu\n", __func__, chunks[i].tokens.size());
            for (int j = 0; j < (int) chunks[i].tokens.size(); j++) {
                LOG_INF("%6d -> '%s'\n", chunks[i].tokens[j], common_token_to_piece(ctx, chunks[i].tokens[j]).c_str());
            }
            LOG_INF("\n\n");
        }
    }

    // initialize batch
    const int n_chunks = chunks.size();
    struct llama_batch batch = llama_batch_init(n_batch, 0, 1);

    // allocate output
    const int n_embd = llama_model_n_embd(model);
    std::vector<float> embeddings(n_chunks * n_embd, 0);
    float * emb = embeddings.data();

    // break into batches
    int p = 0; // number of prompts processed already
    int s = 0; // number of prompts in current batch
    for (int k = 0; k < n_chunks; k++) {
        // clamp to n_batch tokens
        auto & inp = chunks[k].tokens;

        const uint64_t n_toks = inp.size();

        // encode if at capacity
        if (batch.n_tokens + n_toks > n_batch) {
            float * out = emb + p * n_embd;
            batch_decode(ctx, batch, out, s, n_embd);
            common_batch_clear(batch);
            p += s;
            s = 0;
        }

        // add to batch
        batch_add_seq(batch, inp, s);
        s += 1;
    }

    // final batch
    float * out = emb + p * n_embd;
    batch_decode(ctx, batch, out, s, n_embd);

    // save embeddings to chunks
    for (int i = 0; i < n_chunks; i++) {
        chunks[i].embedding = std::vector<float>(emb + i * n_embd, emb + (i + 1) * n_embd);
        // clear tokens as they are no longer needed
        chunks[i].tokens.clear();
    }

    struct llama_batch query_batch = llama_batch_init(n_batch, 0, 1);

    // start loop, receive query and return top k similar chunks based on cosine similarity
    std::string query;
    while (true) {
        LOG("Enter query: ");
        std::getline(std::cin, query);
        std::vector<int32_t> query_tokens = common_tokenize(ctx, query, true);

        batch_add_seq(query_batch, query_tokens, 0);

        std::vector<float> query_emb(n_embd, 0);
        batch_decode(ctx, query_batch, query_emb.data(), 1, n_embd);

        common_batch_clear(query_batch);

        // compute cosine similarities
        {
            std::vector<std::pair<int, float>> similarities;
            for (int i = 0; i < n_chunks; i++) {
                float sim = common_embd_similarity_cos(chunks[i].embedding.data(), query_emb.data(), n_embd);
                similarities.push_back(std::make_pair(i, sim));
            }

            // sort similarities
            std::sort(similarities.begin(), similarities.end(), [](const std::pair<int, float> & a, const std::pair<int, float> & b) {
                return a.second > b.second;
            });

            LOG("Top %d similar chunks:\n", params.sampling.top_k);
            for (int i = 0; i < std::min(params.sampling.top_k, (int) chunks.size()); i++) {
                LOG("filename: %s\n", chunks[similarities[i].first].filename.c_str());
                LOG("filepos: %lld\n", (long long int) chunks[similarities[i].first].filepos);
                LOG("similarity: %f\n", similarities[i].second);
                LOG("textdata:\n%s\n", chunks[similarities[i].first].textdata.c_str());
                LOG("--------------------\n");
            }
        }
    }

    LOG("\n");
    llama_perf_context_print(ctx);

    // clean up
    llama_batch_free(query_batch);
    llama_backend_free();
}